

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O2

GenericVec4
deqp::gles31::Functional::anon_unknown_1::mapToFormatColorUnits
          (TextureFormat *texFormat,Vec4 *normalizedRange)

{
  TextureChannelClass TVar1;
  TextureFormatInfo texFormatInfo;
  anon_union_16_3_1194ccdc_for_v local_78;
  tcu local_60 [16];
  TextureFormatInfo local_50;
  
  tcu::getTextureFormatInfo(&local_50,texFormat);
  TVar1 = tcu::getTextureChannelClass(texFormat->type);
  switch(TVar1) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    tcu::operator*(local_60,2.0,normalizedRange);
    tcu::operator-((tcu *)&local_78,(Vector<float,_4> *)local_60,1.0);
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    local_78 = *(anon_union_16_3_1194ccdc_for_v *)normalizedRange->m_data;
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    tcu::mix<float,4>(local_60,&local_50.valueMin,&local_50.valueMax,normalizedRange);
    tcu::Vector<float,_4>::cast<int>((Vector<float,_4> *)&local_78);
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    tcu::mix<float,4>(local_60,&local_50.valueMin,&local_50.valueMax,normalizedRange);
    tcu::Vector<float,_4>::cast<unsigned_int>((Vector<float,_4> *)&local_78);
    break;
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    tcu::operator*(local_60,normalizedRange,&local_50.valueMax);
    tcu::operator+((tcu *)&local_78,&local_50.valueMin,(Vector<float,_4> *)local_60);
    break;
  default:
    local_78 = (anon_union_16_3_1194ccdc_for_v)0x0;
  }
  return (GenericVec4)local_78;
}

Assistant:

rr::GenericVec4 mapToFormatColorUnits (const tcu::TextureFormat& texFormat, const tcu::Vec4& normalizedRange)
{
	const tcu::TextureFormatInfo texFormatInfo = tcu::getTextureFormatInfo(texFormat);

	switch (tcu::getTextureChannelClass(texFormat.type))
	{
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:		return rr::GenericVec4(normalizedRange);
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:		return rr::GenericVec4(normalizedRange * 2.0f - 1.0f);
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:			return rr::GenericVec4(texFormatInfo.valueMin + normalizedRange * texFormatInfo.valueMax);
		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:			return rr::GenericVec4(tcu::mix(texFormatInfo.valueMin, texFormatInfo.valueMax, normalizedRange).cast<deInt32>());
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:			return rr::GenericVec4(tcu::mix(texFormatInfo.valueMin, texFormatInfo.valueMax, normalizedRange).cast<deUint32>());

		default:
			DE_ASSERT(false);
			return rr::GenericVec4();
	}
}